

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  pointer pbVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer pFVar4;
  pointer pbVar5;
  int iVar6;
  IStream *pIVar7;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar8;
  undefined4 extraout_var;
  iterator __end2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  pointer pbVar9;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_188;
  undefined1 local_168 [32];
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  pointer local_e8;
  pointer puStack_e0;
  pointer local_d8;
  pointer puStack_d0;
  pointer local_c8;
  pointer puStack_c0;
  pointer local_b8;
  pointer puStack_b0;
  pointer local_a8;
  pointer pFStack_a0;
  pointer local_98;
  pointer pFStack_90;
  pointer local_88;
  pointer pbStack_80;
  pointer local_78;
  ITagAliasRegistry *local_70;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  (this->super_IConfig)._vptr_IConfig = (_func_int **)&PTR__Config_001f8f30;
  ConfigData::ConfigData(&this->m_data,data);
  local_168._0_8_ = (this->m_data).outputFilename._M_dataplus._M_p;
  local_168._8_8_ = (this->m_data).outputFilename._M_string_length;
  pIVar7 = makeStream((StringRef *)local_168);
  (this->m_stream).m_ptr = pIVar7;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hasTestFilters = false;
  pbVar9 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar1) {
    do {
      trim((string *)local_168,pbVar9);
      std::__cxx11::string::operator=((string *)pbVar9,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar1);
  }
  pbVar9 = (this->m_data).sectionsToRun.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_data).sectionsToRun.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar1) {
    do {
      trim((string *)local_168,pbVar9);
      std::__cxx11::string::operator=((string *)pbVar9,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar1);
  }
  pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar6 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[4])(pSVar8);
  local_70 = (ITagAliasRegistry *)CONCAT44(extraout_var,iVar6);
  local_148._M_p = (pointer)&local_138;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = (char *)0x0;
  local_168._16_8_ = 0;
  local_168._24_8_ = 0;
  local_140 = 0;
  local_138._M_local_buf[0] = '\0';
  local_128._M_p = (pointer)&local_118;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_e8 = (pointer)0x0;
  puStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  puStack_d0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  puStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  puStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  pFStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  pFStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pbStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pbVar9 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar1) {
    this->m_hasTestFilters = true;
    do {
      TestSpecParser::parse((TestSpecParser *)local_168,pbVar9);
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar1);
  }
  TestSpecParser::addFilter((TestSpecParser *)local_168);
  pbVar5 = local_78;
  pbVar1 = pbStack_80;
  pbVar9 = local_88;
  pFVar4 = pFStack_90;
  pFVar3 = local_98;
  pFVar2 = pFStack_a0;
  pFStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  pFStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pbStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  local_188.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pFVar4;
  local_188.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_188.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_testSpec).m_filters.
       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = pFVar2;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar3;
  local_68.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_188);
  local_188.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->m_testSpec).m_invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar5;
  local_188.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_testSpec).m_invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_188.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->m_testSpec).m_invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar9;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  local_50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector(&local_68)
  ;
  TestSpecParser::~TestSpecParser((TestSpecParser *)local_168);
  return;
}

Assistant:

Config::Config(ConfigData const &data)
        : m_data(data),
        m_stream(openStream())
    {
        // We need to trim filter specs to avoid trouble with superfluous
        // whitespace (esp. important for bdd macros, as those are manually
        // aligned with whitespace).

        for (auto &elem : m_data.testsOrTags) {
            elem = trim(elem);
        }
        for (auto &elem : m_data.sectionsToRun) {
            elem = trim(elem);
        }

        TestSpecParser parser(ITagAliasRegistry::get());
        if (!m_data.testsOrTags.empty()) {
            m_hasTestFilters = true;
            for (auto const &testOrTags : m_data.testsOrTags) {
                parser.parse(testOrTags);
            }
        }
        m_testSpec = parser.testSpec();
    }